

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

Page * page_merge_dirty(Page *pA,Page *pB)

{
  Page *pPVar1;
  Page local_68;
  
  local_68.pDirtyPrev = (Page *)0x0;
  pPVar1 = &local_68;
  while ((pA != (Page *)0x0 && (pB != (Page *)0x0))) {
    if (pA->pgno < pB->pgno) {
      pPVar1->pDirtyPrev = pA;
      pA->pDirtyNext = pPVar1;
      pPVar1 = pA;
      pA = pA->pDirtyPrev;
    }
    else {
      pPVar1->pDirtyPrev = pB;
      pB->pDirtyNext = pPVar1;
      pPVar1 = pB;
      pB = pB->pDirtyPrev;
    }
  }
  if (pA == (Page *)0x0) {
    if (pB == (Page *)0x0) {
      pPVar1->pDirtyNext = (Page *)0x0;
      pPVar1->pDirtyPrev = (Page *)0x0;
    }
    else {
      pPVar1->pDirtyPrev = pB;
      pB->pDirtyNext = pPVar1;
    }
  }
  else {
    pPVar1->pDirtyPrev = pA;
    pA->pDirtyNext = pPVar1;
  }
  return local_68.pDirtyPrev;
}

Assistant:

static Page * page_merge_dirty(Page *pA, Page *pB)
{
	Page result, *pTail;
    /* Prevent compiler warning */
	result.pDirtyNext = result.pDirtyPrev = 0;
	pTail = &result;
	while( pA && pB ){
		if( pA->pgno < pB->pgno ){
			pTail->pDirtyPrev = pA;
			pA->pDirtyNext = pTail;
			pTail = pA;
			pA = pA->pDirtyPrev;
		}else{
			pTail->pDirtyPrev = pB;
			pB->pDirtyNext = pTail;
			pTail = pB;
			pB = pB->pDirtyPrev;
		}
	}
	if( pA ){
		pTail->pDirtyPrev = pA;
		pA->pDirtyNext = pTail;
	}else if( pB ){
		pTail->pDirtyPrev = pB;
		pB->pDirtyNext = pTail;
	}else{
		pTail->pDirtyPrev = pTail->pDirtyNext = 0;
	}
	return result.pDirtyPrev;
}